

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcTerminatorSymbol::~IfcTerminatorSymbol(IfcTerminatorSymbol *this)

{
  undefined1 *puVar1;
  void *pvVar2;
  
  *(undefined8 *)
   &this[-1].super_IfcAnnotationSymbolOccurrence.super_IfcAnnotationOccurrence.super_IfcStyledItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcStyledItem,_3UL>.field_0x20 = 0x8a1db0;
  (this->super_IfcAnnotationSymbolOccurrence).super_IfcAnnotationOccurrence.super_IfcStyledItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcStyledItem,_3UL>.aux_is_derived.
  super__Base_bitset<1UL>._M_w = 0x8a1e00;
  *(undefined8 *)
   &this[-1].super_IfcAnnotationSymbolOccurrence.super_IfcAnnotationOccurrence.super_IfcStyledItem.
    field_0x40 = 0x8a1dd8;
  puVar1 = *(undefined1 **)
            &this[-1].super_IfcAnnotationSymbolOccurrence.super_IfcAnnotationOccurrence.
             super_IfcStyledItem.field_0x78;
  if (puVar1 != &this[-1].super_IfcAnnotationSymbolOccurrence.super_IfcAnnotationOccurrence.
                 field_0x88) {
    operator_delete(puVar1);
  }
  pvVar2 = *(void **)((long)&this[-1].super_IfcAnnotationSymbolOccurrence.
                             super_IfcAnnotationOccurrence.super_IfcStyledItem.Name.ptr.field_2 + 8)
  ;
  if (pvVar2 != (void *)0x0) {
    operator_delete(pvVar2);
  }
  operator_delete(&this[-1].super_IfcAnnotationSymbolOccurrence.super_IfcAnnotationOccurrence.
                   super_IfcStyledItem.
                   super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcStyledItem,_3UL>.field_0x20);
  return;
}

Assistant:

IfcTerminatorSymbol() : Object("IfcTerminatorSymbol") {}